

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BalanceFunction.cpp
# Opt level: O0

void __thiscall
BalanceFunction::BalanceFunction
          (BalanceFunction *this,ParameterReader *paraRdr,string *path,
          shared_ptr<RandomUtil::Random> *ran_gen)

{
  string *in_RDX;
  int __x;
  string *in_RDI;
  allocator<char> *this_00;
  double dVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  vector<double,_std::allocator<double>_> *this_01;
  int i;
  shared_ptr<RandomUtil::Random> *in_stack_fffffffffffffd38;
  weak_ptr<RandomUtil::Random> *in_stack_fffffffffffffd40;
  ParameterReader *in_stack_fffffffffffffd48;
  ParameterReader *in_stack_fffffffffffffd50;
  allocator *paVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  string *in_stack_fffffffffffffd88;
  string *name;
  ParameterReader *in_stack_fffffffffffffd90;
  ParameterReader *this_03;
  int local_148;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  undefined1 local_f1 [40];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [80];
  
  ParameterReader::ParameterReader(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::__cxx11::string::string((string *)in_RDI[1].field_2._M_local_buf,in_RDX);
  std::shared_ptr<particleSamples>::shared_ptr((shared_ptr<particleSamples> *)0x18845b);
  std::weak_ptr<RandomUtil::Random>::weak_ptr((weak_ptr<RandomUtil::Random> *)0x188474);
  pretty_ostream::pretty_ostream((pretty_ostream *)0x18848d);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1884ab);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1884c7);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1884e3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1884ff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x18851b);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x188537);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x188553);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x18856f);
  std::weak_ptr<RandomUtil::Random>::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"particle_alpha",&local_51);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  *(int *)&in_RDI[0xf]._M_string_length = (int)dVar1;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"particle_beta",&local_79);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  *(int *)((long)&in_RDI[0xf]._M_string_length + 4) = (int)dVar1;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if ((int)in_RDI[0xf]._M_string_length == -*(int *)((long)&in_RDI[0xf]._M_string_length + 4)) {
    in_RDI[0xf].field_2._M_local_buf[0] = '\x01';
  }
  else {
    in_RDI[0xf].field_2._M_local_buf[0] = '\0';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"BpT_min",&local_a1);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  *(double *)(in_RDI + 0x12) = dVar1;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"BpT_max",&local_c9);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  in_RDI[0x12]._M_string_length = (size_type)dVar1;
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  this_03 = (ParameterReader *)local_f1;
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f1 + 1),"Bnpts",(allocator *)this_03);
  dVar1 = ParameterReader::getVal(this_03,name);
  *(int *)((long)&in_RDI[0x10]._M_string_length + 4) = (int)dVar1;
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"Brap_max",&local_119);
  dVar1 = ParameterReader::getVal(this_03,name);
  in_RDI[0x11].field_2._M_allocated_capacity = (size_type)dVar1;
  std::__cxx11::string::~string(local_118);
  this_00 = (allocator<char> *)&local_119;
  std::allocator<char>::~allocator(this_00);
  __x = (int)this_00;
  std::abs(__x);
  *(double *)((long)&in_RDI[0x11].field_2 + 8) =
       ((double)extraout_XMM0_Qa + (double)extraout_XMM0_Qa) /
       (double)(*(int *)((long)&in_RDI[0x10]._M_string_length + 4) + -1);
  this_02 = extraout_XMM0_Qa;
  std::abs(__x);
  in_RDI[0x11]._M_string_length =
       (size_type)(*(double *)((long)&in_RDI[0x11].field_2 + 8) * -0.5 - extraout_XMM0_Qa_00);
  *(undefined4 *)&in_RDI[0x10].field_2 = 0x14;
  *(double *)((long)&in_RDI[0x10].field_2 + 8) =
       6.283185307179586 / (double)*(int *)&in_RDI[0x10].field_2;
  *(undefined8 *)(in_RDI + 0x11) = 0xbff921fb54442d18;
  paVar2 = &local_141;
  dVar1 = extraout_XMM0_Qa_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"rap_type",paVar2);
  this_01 = (vector<double,_std::allocator<double>_> *)ParameterReader::getVal(this_03,name);
  *(int *)&in_RDI[0x10]._M_string_length = (int)(double)this_01;
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(size_type)dVar1);
  for (local_148 = 0; local_148 < *(int *)((long)&in_RDI[0x10]._M_string_length + 4);
      local_148 = local_148 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&in_RDI[0x12].field_2,(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188c87);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&in_RDI[0x13]._M_string_length,(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188cd0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)((long)&in_RDI[0x14].field_2 + 8),(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188d19);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x14),(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188d62);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&in_RDI[0x15].field_2,(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188dab);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&in_RDI[0x16]._M_string_length,(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188df4);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)((long)&in_RDI[0x17].field_2 + 8),(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188e3d);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x17),(long)local_148);
    std::vector<double,_std::allocator<double>_>::assign
              (this_01,(size_type)in_stack_fffffffffffffd38,(value_type *)0x188e86);
  }
  *(undefined8 *)((long)&in_RDI[0xf].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

BalanceFunction::BalanceFunction(
    const ParameterReader& paraRdr, const std::string path,
    std::shared_ptr<RandomUtil::Random> ran_gen)
    : paraRdr_(paraRdr), path_(path) {
    ran_gen_ptr = ran_gen;

    particle_monval_a = paraRdr_.getVal("particle_alpha");
    particle_monval_b = paraRdr_.getVal("particle_beta");
    if (particle_monval_a == -particle_monval_b)
        same_species = true;
    else
        same_species = false;

    BpT_min = paraRdr_.getVal("BpT_min");
    BpT_max = paraRdr_.getVal("BpT_max");
    Bnpts = paraRdr_.getVal("Bnpts");
    Brap_max = paraRdr_.getVal("Brap_max");
    drap = 2. * std::abs(Brap_max) / (Bnpts - 1);
    Brap_min = -std::abs(Brap_max) - 0.5 * drap;
    Bnphi = 20;
    dphi = 2. * M_PI / Bnphi;
    Bphi_min = -M_PI / 2.;

    rap_type_ = paraRdr_.getVal("rap_type");

    C_ab.resize(Bnpts);
    C_abarbbar.resize(Bnpts);
    C_abarb.resize(Bnpts);
    C_abbar.resize(Bnpts);
    C_mixed_ab.resize(Bnpts);
    C_mixed_abarbbar.resize(Bnpts);
    C_mixed_abarb.resize(Bnpts);
    C_mixed_abbar.resize(Bnpts);
    for (int i = 0; i < Bnpts; i++) {
        C_ab[i].assign(Bnphi, 0.);
        C_abarbbar[i].assign(Bnphi, 0.);
        C_abarb[i].assign(Bnphi, 0.);
        C_abbar[i].assign(Bnphi, 0.);
        C_mixed_ab[i].assign(Bnphi, 0.);
        C_mixed_abarbbar[i].assign(Bnphi, 0.);
        C_mixed_abarb[i].assign(Bnphi, 0.);
        C_mixed_abbar[i].assign(Bnphi, 0.);
    }

    N_b = 0;
    N_bbar = 0;
}